

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

bool __thiscall flow::lang::Parser::consumeUntil(Parser *this,Token value)

{
  Token TVar1;
  
  while (TVar1 = ((this->lexer_)._M_t.
                  super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_,
        TVar1 != value) {
    if (TVar1 == Eof) goto LAB_0011e986;
    nextToken(this);
  }
  nextToken(this);
LAB_0011e986:
  return TVar1 == value;
}

Assistant:

bool Parser::consumeUntil(Token value) {
  for (;;) {
    if (token() == value) {
      nextToken();
      return true;
    }

    if (token() == Token::Eof) return false;

    nextToken();
  }
}